

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lm_trie.c
# Opt level: O3

void lm_trie_alloc_ngram(lm_trie_t *trie,uint32 *counts,int order)

{
  ulong uVar1;
  uint32 uVar2;
  uint32 uVar3;
  int iVar4;
  void *base_mem;
  uint8 uVar5;
  uint8 uVar6;
  uint8 uVar7;
  uint uVar8;
  middle_t *pmVar9;
  void *ptr;
  longest_t *plVar10;
  long lVar11;
  size_t sVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  uint8 *local_68;
  
  uVar8 = order - 1;
  trie->ngram_mem_size = 0;
  if (2 < order) {
    uVar13 = 1;
    do {
      uVar5 = lm_trie_quant_msize(trie->quant);
      uVar2 = *counts;
      uVar1 = uVar13 + 1;
      uVar3 = counts[uVar13];
      uVar6 = bitarr_required_bits(counts[uVar13 + 1]);
      uVar7 = bitarr_required_bits(uVar2);
      trie->ngram_mem_size =
           (ulong)((uint)(byte)(uVar7 + uVar6 + uVar5) * (uVar3 + 1) + 7 >> 3) +
           trie->ngram_mem_size + 8;
      uVar13 = uVar1;
    } while (uVar8 != uVar1);
  }
  uVar5 = lm_trie_quant_lsize(trie->quant);
  uVar2 = counts[(int)uVar8];
  uVar6 = bitarr_required_bits(*counts);
  sVar12 = (ulong)((uint)(byte)(uVar6 + uVar5) * (uVar2 + 1) + 7 >> 3) + trie->ngram_mem_size + 8;
  trie->ngram_mem_size = sVar12;
  local_68 = (uint8 *)__ckd_calloc__(sVar12,1,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
                                     ,0x1e2);
  trie->ngram_mem = local_68;
  sVar12 = (size_t)(order + -2);
  pmVar9 = (middle_t *)
           __ckd_calloc__(sVar12,0x30,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
                          ,0x1e5);
  trie->middle_begin = pmVar9;
  trie->middle_end = pmVar9 + sVar12;
  lVar14 = 8;
  ptr = __ckd_calloc__(sVar12,8,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
                       ,0x1e8);
  if (order < 3) {
    plVar10 = (longest_t *)
              __ckd_calloc__(1,0x20,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
                             ,0x1ef);
    trie->longest = plVar10;
  }
  else {
    do {
      *(uint8 **)((long)ptr + lVar14 * 2 + -0x10) = local_68;
      uVar5 = lm_trie_quant_msize(trie->quant);
      uVar2 = *counts;
      iVar4 = *(int *)((long)counts + lVar14 + -4);
      uVar6 = bitarr_required_bits(*(uint32 *)((long)counts + lVar14));
      uVar7 = bitarr_required_bits(uVar2);
      local_68 = local_68 + (ulong)((uint)(byte)(uVar7 + uVar6 + uVar5) * (iVar4 + 1) + 7 >> 3) + 8;
      lVar14 = lVar14 + 4;
    } while ((ulong)(uint)order << 2 != lVar14);
    plVar10 = (longest_t *)
              __ckd_calloc__(1,0x20,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
                             ,0x1ef);
    trie->longest = plVar10;
    if (2 < order) {
      uVar13 = (ulong)uVar8;
      lVar15 = uVar13 * 0x30 + -0x60;
      lVar14 = 0;
      do {
        pmVar9 = trie->middle_begin;
        base_mem = *(void **)((long)ptr + lVar14 * 8 + uVar13 * 8 + -0x10);
        uVar5 = lm_trie_quant_msize(trie->quant);
        lVar11 = lVar14 + -1;
        if (lVar14 == 0) {
          plVar10 = trie->longest;
        }
        else {
          plVar10 = (longest_t *)(&trie->middle_begin[1].base.word_bits + lVar15);
        }
        middle_init((middle_t *)(&(pmVar9->base).word_bits + lVar15),base_mem,uVar5,
                    counts[uVar13 + lVar14 + -1],*counts,counts[uVar13 + lVar14],plVar10);
        lVar15 = lVar15 + -0x30;
        lVar14 = lVar11;
      } while (2 < uVar13 + 1 + lVar11);
    }
  }
  ckd_free(ptr);
  plVar10 = trie->longest;
  uVar5 = lm_trie_quant_lsize(trie->quant);
  base_init(&plVar10->base,local_68,*counts,uVar5);
  return;
}

Assistant:

static void
lm_trie_alloc_ngram(lm_trie_t * trie, uint32 * counts, int order)
{
    int i;
    uint8 *mem_ptr;
    uint8 **middle_starts;

    trie->ngram_mem_size = 0;
    for (i = 1; i < order - 1; i++) {
        trie->ngram_mem_size +=
            middle_size(lm_trie_quant_msize(trie->quant), counts[i],
                        counts[0], counts[i + 1]);
    }
    trie->ngram_mem_size +=
        longest_size(lm_trie_quant_lsize(trie->quant), counts[order - 1],
                     counts[0]);
    trie->ngram_mem =
        (uint8 *) ckd_calloc(trie->ngram_mem_size,
                             sizeof(*trie->ngram_mem));
    mem_ptr = trie->ngram_mem;
    trie->middle_begin =
        (middle_t *) ckd_calloc(order - 2, sizeof(*trie->middle_begin));
    trie->middle_end = trie->middle_begin + (order - 2);
    middle_starts =
        (uint8 **) ckd_calloc(order - 2, sizeof(*middle_starts));
    for (i = 2; i < order; i++) {
        middle_starts[i - 2] = mem_ptr;
        mem_ptr +=
            middle_size(lm_trie_quant_msize(trie->quant), counts[i - 1],
                        counts[0], counts[i]);
    }
    trie->longest = (longest_t *) ckd_calloc(1, sizeof(*trie->longest));
    /* Crazy backwards thing so we initialize using pointers to ones that have already been initialized */
    for (i = order - 1; i >= 2; --i) {
        middle_t *middle_ptr = &trie->middle_begin[i - 2];
        middle_init(middle_ptr, middle_starts[i - 2],
                    lm_trie_quant_msize(trie->quant), counts[i - 1],
                    counts[0], counts[i],
                    (i ==
                     order -
                     1) ? (void *) trie->longest : (void *) &trie->
                    middle_begin[i - 1]);
    }
    ckd_free(middle_starts);
    longest_init(trie->longest, mem_ptr, lm_trie_quant_lsize(trie->quant),
                 counts[0]);
}